

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::
UnaryExpr<const_args::MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>_&>
::streamReconstructedExpression
          (UnaryExpr<const_args::MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>_&>
           *this,ostream *os)

{
  MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>
  *in_RDX;
  string local_38;
  ostream *local_18;
  ostream *os_local;
  UnaryExpr<const_args::MapFlag<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_MappingEnum,_ToLowerReader,_args::detail::unordered_map>_&>
  *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  Detail::
  stringify<args::MapFlag<std::__cxx11::string,MappingEnum,ToLowerReader,args::detail::unordered_map>>
            (&local_38,(Detail *)this->m_lhs,in_RDX);
  std::operator<<(os,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            os << Catch::Detail::stringify( m_lhs );
        }